

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode Curl_connect_only_attach(Curl_easy *data)

{
  CURLcode CVar1;
  connectdata *c;
  connectdata *local_18;
  
  local_18 = (connectdata *)0x0;
  CVar1 = easy_connection(data,&local_18);
  if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, data->conn == (connectdata *)0x0)) {
    Curl_attach_connection(data,local_18);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_connect_only_attach(struct Curl_easy *data)
{
  CURLcode result;
  struct connectdata *c = NULL;

  result = easy_connection(data, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  return CURLE_OK;
}